

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O0

void to_js_print_conditional_expression_tree
               (FILE *out,AST_Conditional_Expression *cond,Program *program)

{
  Program *program_local;
  AST_Conditional_Expression *cond_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"(");
  to_js_print_ast(out,cond->left,program);
  fprintf((FILE *)out,"?");
  to_js_print_ast(out,cond->center,program);
  fprintf((FILE *)out,":");
  to_js_print_ast(out,cond->right,program);
  fprintf((FILE *)out,")");
  return;
}

Assistant:

void to_js_print_conditional_expression_tree(FILE* out,struct AST_Conditional_Expression *cond,struct Program *program)
{
	fprintf(out,"(");
	to_js_print_ast(out,cond->left,program);
	fprintf(out,"?");
	to_js_print_ast(out,cond->center,program);
	fprintf(out,":");
	to_js_print_ast(out,cond->right,program);
	fprintf(out,")");
}